

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestAllTypes::Clear(TestAllTypes *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  Arena *pAVar3;
  LogMessage local_d0;
  Voidify local_ba;
  byte local_b9;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_8a;
  byte local_89;
  LogMessage local_88;
  Voidify local_72;
  byte local_71;
  LogMessage local_70;
  Voidify local_5a;
  byte local_59;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestAllTypes *pTStack_18;
  uint32_t cached_has_bits;
  TestAllTypes *this_local;
  
  this_local = (TestAllTypes *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_int64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_uint32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_uint64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sint32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sint64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_fixed32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_fixed64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sfixed32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sfixed64_);
  google::protobuf::RepeatedField<float>::Clear(&(this->field_0)._impl_.repeated_float_);
  google::protobuf::RepeatedField<double>::Clear(&(this->field_0)._impl_.repeated_double_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_bytes_);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup>::Clear
            (&(this->field_0)._impl_.repeatedgroup_);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::Clear
            (&(this->field_0)._impl_.repeated_nested_message_);
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::Clear
            (&(this->field_0)._impl_.repeated_foreign_message_);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::Clear
            (&(this->field_0)._impl_.repeated_import_message_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_nested_enum_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_foreign_enum_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_import_enum_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string_piece_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_cord_);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::Clear
            (&(this->field_0)._impl_.repeated_lazy_message_);
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    if ((local_1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_);
    }
    if ((local_1c & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_bytes_);
    }
    if ((local_1c & 4) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_piece_);
    }
    if ((local_1c & 8) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_cord_);
    }
    if ((local_1c & 0x10) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.optionalgroup_ == (TestAllTypes_OptionalGroup *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x23fa,"_impl_.optionalgroup_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      TestAllTypes_OptionalGroup::Clear((this->field_0)._impl_.optionalgroup_);
    }
    if ((local_1c & 0x20) != 0) {
      local_59 = 0;
      if ((this->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x23fe,"_impl_.optional_nested_message_ != nullptr");
        local_59 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
      }
      if ((local_59 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      edition_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_nested_message_);
    }
    if ((local_1c & 0x40) != 0) {
      local_71 = 0;
      if ((this->field_0)._impl_.optional_foreign_message_ == (ForeignMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2402,"_impl_.optional_foreign_message_ != nullptr");
        local_71 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_5a,pLVar2);
      }
      if ((local_71 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_70);
      }
      edition_unittest::ForeignMessage::Clear((this->field_0)._impl_.optional_foreign_message_);
    }
    if ((local_1c & 0x80) != 0) {
      local_89 = 0;
      if ((this->field_0)._impl_.optional_import_message_ == (ImportMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2406,"_impl_.optional_import_message_ != nullptr");
        local_89 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_72,pLVar2);
      }
      if ((local_89 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      proto2_unittest_import::ImportMessage::Clear((this->field_0)._impl_.optional_import_message_);
    }
  }
  if ((local_1c & 0x700) != 0) {
    if ((local_1c & 0x100) != 0) {
      local_a1 = 0;
      if ((this->field_0)._impl_.optional_public_import_message_ == (PublicImportMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x240c,"_impl_.optional_public_import_message_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_8a,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      proto2_unittest_import::PublicImportMessage::Clear
                ((this->field_0)._impl_.optional_public_import_message_);
    }
    if ((local_1c & 0x200) != 0) {
      local_b9 = 0;
      if ((this->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2410,"_impl_.optional_lazy_message_ != nullptr");
        local_b9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
      }
      if ((local_b9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      edition_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_lazy_message_);
    }
    if ((local_1c & 0x400) != 0) {
      if ((this->field_0)._impl_.optional_unverified_lazy_message_ ==
          (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x2414,"_impl_.optional_unverified_lazy_message_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ba,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d0);
      }
      edition_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_unverified_lazy_message_);
    }
  }
  if ((local_1c & 0xf800) != 0) {
    memset((void *)((long)&this->field_0 + 0x288),0,0x20);
  }
  if ((local_1c & 0xff0000) != 0) {
    memset((void *)((long)&this->field_0 + 0x2a8),0,0x29);
  }
  if ((local_1c & 0xff000000) != 0) {
    (this->field_0)._impl_.optional_import_enum_ = 7;
    (this->field_0)._impl_.optional_nested_enum_ = 1;
    (this->field_0)._impl_.optional_foreign_enum_ = 4;
    if ((local_1c & 0x8000000) != 0) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_string_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_string_,
                 pAVar3);
    }
    if ((local_1c & 0x10000000) != 0) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_bytes_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_bytes_,
                 pAVar3);
    }
    if ((local_1c & 0x20000000) != 0) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_string_piece_,
                 (LazyString *)
                 Impl_::_i_give_permission_to_break_this_code_default_default_string_piece_,pAVar3);
    }
    if ((local_1c & 0x40000000) != 0) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_cord_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_cord_,
                 pAVar3);
    }
    if ((local_1c & 0x80000000) != 0) {
      absl::lts_20250127::Cord::Clear(&(this->field_0)._impl_.optional_bytes_cord_);
    }
  }
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,1);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    (this->field_0)._impl_.default_int64_ = 0x2a;
    (this->field_0)._impl_.default_int32_ = 0x29;
    (this->field_0)._impl_.default_uint32_ = 0x2b;
    (this->field_0)._impl_.default_uint64_ = 0x2c;
    (this->field_0)._impl_.default_sint64_ = 0x2e;
    (this->field_0)._impl_.default_sint32_ = -0x2d;
    (this->field_0)._impl_.default_fixed32_ = 0x2f;
    (this->field_0)._impl_.default_fixed64_ = 0x30;
  }
  if ((local_1c & 0xff00) != 0) {
    (this->field_0)._impl_.default_sfixed64_ = -0x32;
    (this->field_0)._impl_.default_sfixed32_ = 0x31;
    (this->field_0)._impl_.default_float_ = 51.5;
    (this->field_0)._impl_.default_double_ = 52000.0;
    (this->field_0)._impl_.default_bool_ = true;
    (this->field_0)._impl_.default_nested_enum_ = 2;
    (this->field_0)._impl_.default_foreign_enum_ = 5;
    (this->field_0)._impl_.default_import_enum_ = 8;
  }
  clear_oneof_field(this);
  google::protobuf::internal::HasBits<2>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_string_.Clear();
  _impl_.repeated_bytes_.Clear();
  _impl_.repeatedgroup_.Clear();
  _impl_.repeated_nested_message_.Clear();
  _impl_.repeated_foreign_message_.Clear();
  _impl_.repeated_import_message_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _impl_.repeated_foreign_enum_.Clear();
  _impl_.repeated_import_enum_.Clear();
  _impl_.repeated_string_piece_.Clear();
  _impl_.repeated_cord_.Clear();
  _impl_.repeated_lazy_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.optional_string_piece_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.optional_cord_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.optional_nested_message_ != nullptr);
      _impl_.optional_nested_message_->Clear();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(_impl_.optional_foreign_message_ != nullptr);
      _impl_.optional_foreign_message_->Clear();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(_impl_.optional_import_message_ != nullptr);
      _impl_.optional_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(_impl_.optional_public_import_message_ != nullptr);
      _impl_.optional_public_import_message_->Clear();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_message_ != nullptr);
      _impl_.optional_lazy_message_->Clear();
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(_impl_.optional_unverified_lazy_message_ != nullptr);
      _impl_.optional_unverified_lazy_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000f800u) != 0) {
    ::memset(&_impl_.optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_sint64_) -
        reinterpret_cast<char*>(&_impl_.optional_int64_)) + sizeof(_impl_.optional_sint64_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.optional_sint32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_bool_) -
        reinterpret_cast<char*>(&_impl_.optional_sint32_)) + sizeof(_impl_.optional_bool_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    _impl_.optional_import_enum_ = 7;
    _impl_.optional_nested_enum_ = 1;
    _impl_.optional_foreign_enum_ = 4;
    if ((cached_has_bits & 0x08000000u) != 0) {
      _impl_.default_string_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_string_, GetArena());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _impl_.default_bytes_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_bytes_, GetArena());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _impl_.default_string_piece_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_string_piece_, GetArena());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _impl_.default_cord_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_cord_, GetArena());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _impl_.optional_bytes_cord_.Clear();
    }
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    _impl_.default_int64_ = ::int64_t{42};
    _impl_.default_int32_ = 41;
    _impl_.default_uint32_ = 43u;
    _impl_.default_uint64_ = ::uint64_t{44u};
    _impl_.default_sint64_ = ::int64_t{46};
    _impl_.default_sint32_ = -45;
    _impl_.default_fixed32_ = 47u;
    _impl_.default_fixed64_ = ::uint64_t{48u};
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    _impl_.default_sfixed64_ = ::int64_t{-50};
    _impl_.default_sfixed32_ = 49;
    _impl_.default_float_ = 51.5f;
    _impl_.default_double_ = 52000;
    _impl_.default_bool_ = true;
    _impl_.default_nested_enum_ = 2;
    _impl_.default_foreign_enum_ = 5;
    _impl_.default_import_enum_ = 8;
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}